

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  cmMessenger *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  Delimiter delim_local;
  cmListFileBacktrace lfbt;
  string local_2a0;
  cmListFileContext lfc;
  cmListFileContext local_210;
  ostringstream m;
  
  delim_local = delim;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char*&,cmListFileArgument::Delimiter&,int&>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
             &this->FunctionArguments,&token->text,&delim_local,&token->line);
  if (this->Separation == SeparationOkay) {
    bVar1 = true;
  }
  else {
    bVar4 = this->Separation != SeparationError;
    bVar5 = delim_local != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
    lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
    lfc.Name._M_string_length = 0;
    lfc.Name.field_2._M_local_buf[0] = '\0';
    lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
    lfc.FilePath._M_string_length = 0;
    lfc.FilePath.field_2._M_local_buf[0] = '\0';
    lfc.Line = 0;
    lfc.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    std::__cxx11::string::assign((char *)&lfc.FilePath);
    lfc.Line = (long)token->line;
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&lfbt,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             *)&this->Backtrace);
    cmListFileContext::cmListFileContext(&local_210,&lfc);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_2a0,
               (cmListFileContext *)&lfbt);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&lfbt,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&local_2a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2a0._M_string_length);
    cmListFileContext::~cmListFileContext(&local_210);
    poVar2 = std::operator<<((ostream *)&m,"Syntax ");
    bVar1 = bVar4 && bVar5;
    pcVar3 = "Error";
    if (bVar4 && bVar5) {
      pcVar3 = "Warning";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," in cmake code at ");
    poVar2 = std::operator<<(poVar2,"column ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,token->column);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Argument not separated from preceding token by whitespace.");
    this_00 = this->Messenger;
    if (bVar4 && bVar5) {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(this_00,AUTHOR_WARNING,&local_2a0,&lfbt);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_2a0,&lfbt);
    }
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmListFileContext::~cmListFileContext(&lfc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m);
  }
  return bVar1;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  this->FunctionArguments.emplace_back(token->text, delim, token->line);
  if (this->Separation == SeparationOkay) {
    return true;
  }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = token->line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);

  m << "Syntax " << (isError ? "Error" : "Warning") << " in cmake code at "
    << "column " << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  /* clang-format on */
  if (isError) {
    this->Messenger->IssueMessage(MessageType::FATAL_ERROR, m.str(), lfbt);
    return false;
  }
  this->Messenger->IssueMessage(MessageType::AUTHOR_WARNING, m.str(), lfbt);
  return true;
}